

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O1

object_ptr __thiscall
mjs::make_accessor_object(mjs *this,gc_heap_ptr<mjs::global_object> *global,value *get,value *set)

{
  size_t num_bytes;
  bool bVar1;
  void *pvVar2;
  long *plVar3;
  long *plVar4;
  undefined8 extraout_RDX;
  object_ptr oVar5;
  value local_68;
  gc_heap_ptr_untyped local_40;
  
  if (get->type_ != undefined) {
    if (get->type_ != object) {
LAB_00156db0:
      __assert_fail("get.type() == value_type::undefined || (get.type() == value_type::object && get.object_value().has_type<function_object>())"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                    ,0xb,
                    "object_ptr mjs::make_accessor_object(const gc_heap_ptr<global_object> &, const value &, const value &)"
                   );
    }
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                      ((gc_heap_ptr_untyped *)&(get->field_1).s_);
    if (!bVar1) goto LAB_00156db0;
  }
  if (set->type_ != undefined) {
    if (set->type_ == object) {
      bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                        ((gc_heap_ptr_untyped *)&(set->field_1).s_);
      if (bVar1) goto LAB_00156c50;
    }
    __assert_fail("set.type() == value_type::undefined || (set.type() == value_type::object && set.object_value().has_type<function_object>())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                  ,0xc,
                  "object_ptr mjs::make_accessor_object(const gc_heap_ptr<global_object> &, const value &, const value &)"
                 );
  }
LAB_00156c50:
  if (set->type_ != undefined || get->type_ != undefined) {
    pvVar2 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    num_bytes = *(size_t *)((long)pvVar2 + 8);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar3 + 0x98))(&local_68,plVar3,"Accessor");
    local_40.heap_ = (gc_heap *)0x0;
    gc_heap::allocate_and_construct<mjs::object,mjs::string,decltype(nullptr)>
              ((gc_heap *)this,num_bytes,(string *)0x20,(void **)&local_68);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_68);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
    plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar4 + 0x98))(&local_68,plVar4,"get");
    (**(code **)(*plVar3 + 8))(plVar3,&local_68,get,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_68);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
    plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar4 + 0x98))(&local_68,plVar4,"set");
    (**(code **)(*plVar3 + 8))(plVar3,&local_68,set,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_68);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
    plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar4 + 0x98))(&local_40,plVar4,"__strict__");
    pvVar2 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    local_68.field_1.b_ = (bool)**(undefined1 **)((long)pvVar2 + 0x28);
    local_68.type_ = boolean;
    (**(code **)(*plVar3 + 8))(plVar3,&local_40,&local_68,0);
    value::destroy(&local_68);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
    oVar5.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    oVar5.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (object_ptr)oVar5.super_gc_heap_ptr_untyped;
  }
  __assert_fail("get.type() != value_type::undefined || set.type() != value_type::undefined",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                ,0xd,
                "object_ptr mjs::make_accessor_object(const gc_heap_ptr<global_object> &, const value &, const value &)"
               );
}

Assistant:

object_ptr make_accessor_object(const gc_heap_ptr<global_object>& global, const value& get, const value& set) {
    assert(get.type() == value_type::undefined || (get.type() == value_type::object && get.object_value().has_type<function_object>()));
    assert(set.type() == value_type::undefined || (set.type() == value_type::object && set.object_value().has_type<function_object>()));
    assert(get.type() != value_type::undefined || set.type() != value_type::undefined);

    auto a = global->heap().make<object>(global->common_string("Accessor"), nullptr);
    a->put(global->common_string("get"), get);
    a->put(global->common_string("set"), set);
    a->put(global->common_string("__strict__"), value{global->strict_mode()}); // Hack
    return a;
}